

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall
t_dart_generator::generate_function_helpers(t_dart_generator *this,t_function *tfunction)

{
  t_program *program;
  t_type *type;
  t_struct *ptVar1;
  int iVar2;
  t_dart_generator *this_00;
  pointer pptVar3;
  t_field success;
  t_struct result;
  string local_200;
  string local_1e0;
  string local_1c0;
  t_field local_1a0;
  t_struct local_f0;
  
  if (tfunction->oneway_ == false) {
    program = (this->super_t_oop_generator).super_t_generator.program_;
    this_00 = (t_dart_generator *)(tfunction->name_)._M_dataplus._M_p;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,this_00,
               (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator
                        + (tfunction->name_)._M_string_length));
    get_result_class_name((string *)&local_1a0,this_00,&local_1c0);
    t_struct::t_struct(&local_f0,program,(string *)&local_1a0);
    if (local_1a0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_1a0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_1a0.super_t_doc._vptr_t_doc);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    type = tfunction->returntype_;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"success","");
    t_field::t_field(&local_1a0,type,&local_1e0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    iVar2 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar2 == '\0') {
      t_struct::append(&local_f0,&local_1a0);
    }
    ptVar1 = tfunction->xceptions_;
    pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar3 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        t_struct::append(&local_f0,*pptVar3);
        pptVar3 = pptVar3 + 1;
      } while (pptVar3 !=
               (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
    generate_dart_struct_definition
              (this,(ostream *)&this->f_service_,&local_f0,false,true,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    t_field::~t_field(&local_1a0);
    local_f0.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eef0;
    if (local_f0.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.members_in_id_order_.
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    t_type::~t_type(&local_f0.super_t_type);
  }
  return;
}

Assistant:

void t_dart_generator::generate_function_helpers(t_function* tfunction) {
  if (tfunction->is_oneway()) {
    return;
  }

  t_struct result(program_, get_result_class_name(tfunction->get_name()));
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }

  generate_dart_struct_definition(f_service_, &result, false, true);
}